

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixGetTempname(int nBuf,char *zBuf)

{
  long lVar1;
  int iVar2;
  char *pBuf;
  char *in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  int rc;
  int iLimit;
  char *zDir;
  u64 r;
  int in_stack_ffffffffffffffcc;
  int local_30;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  local_30 = 0;
  *in_RSI = '\0';
  sqlite3MutexAlloc(in_stack_ffffffffffffffcc);
  sqlite3_mutex_enter((sqlite3_mutex *)0x155d64);
  pBuf = unixTempFileDir();
  if (pBuf == (char *)0x0) {
    local_30 = 0x190a;
  }
  else {
    do {
      sqlite3_randomness((int)((ulong)in_RSI >> 0x20),pBuf);
      in_RSI[(int)(in_EDI - 2)] = '\0';
      sqlite3_snprintf((int)(ulong)in_EDI,in_RSI,"%s/etilqs_%llx%c",pBuf,&DAT_aaaaaaaaaaaaaaaa,0);
      if ((in_RSI[(int)(in_EDI - 2)] != '\0') || (10 < local_2c)) {
        local_30 = 1;
        break;
      }
      iVar2 = (*aSyscall[2].pCurrent)(in_RSI,0);
      local_2c = local_2c + 1;
    } while (iVar2 == 0);
  }
  sqlite3MutexAlloc(in_stack_ffffffffffffffcc);
  sqlite3_mutex_leave((sqlite3_mutex *)0x155e3d);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  const char *zDir;
  int iLimit = 0;
  int rc = SQLITE_OK;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing.
  */
  zBuf[0] = 0;
  SimulateIOError( return SQLITE_IOERR );

  sqlite3_mutex_enter(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_TEMPDIR));
  zDir = unixTempFileDir();
  if( zDir==0 ){
    rc = SQLITE_IOERR_GETTEMPPATH;
  }else{
    do{
      u64 r;
      sqlite3_randomness(sizeof(r), &r);
      assert( nBuf>2 );
      zBuf[nBuf-2] = 0;
      sqlite3_snprintf(nBuf, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX"%llx%c",
                       zDir, r, 0);
      if( zBuf[nBuf-2]!=0 || (iLimit++)>10 ){
        rc = SQLITE_ERROR;
        break;
      }
    }while( osAccess(zBuf,0)==0 );
  }
  sqlite3_mutex_leave(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_TEMPDIR));
  return rc;
}